

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EverCrypt_Hash.c
# Opt level: O0

void EverCrypt_Hash_Incremental_hash
               (Spec_Hash_Definitions_hash_alg a,uint8_t *output,uint8_t *input,uint32_t input_len)

{
  _Bool _Var1;
  uint32_t in_stack_000000c4;
  uint8_t *in_stack_000000c8;
  uint32_t in_stack_000000d4;
  uint8_t *in_stack_000000d8;
  uint32_t in_stack_000000e4;
  uint8_t *in_stack_000000e8;
  _Bool vec256;
  _Bool vec128;
  uint32_t input_len_local;
  uint8_t *input_local;
  uint8_t *output_local;
  Spec_Hash_Definitions_hash_alg a_local;
  
  switch(a) {
  case '\0':
    hash_224(output,input,input_len);
    break;
  case '\x01':
    EverCrypt_Hash_Incremental_hash_256(output,input,input_len);
    break;
  case '\x02':
    Hacl_Hash_SHA2_hash_384(output,input,input_len);
    break;
  case '\x03':
    Hacl_Hash_SHA2_hash_512(output,input,input_len);
    break;
  case '\x04':
    Hacl_Hash_SHA1_hash_oneshot(output,input,input_len);
    break;
  case '\x05':
    Hacl_Hash_MD5_hash_oneshot(output,input,input_len);
    break;
  case '\x06':
    _Var1 = EverCrypt_AutoConfig2_has_vec128();
    if (_Var1) {
      Hacl_Hash_Blake2s_Simd128_hash_with_key(output,0x20,input,input_len,(uint8_t *)0x0,0);
    }
    else {
      Hacl_Hash_Blake2s_hash_with_key(output,0x20,input,input_len,(uint8_t *)0x0,0);
    }
    break;
  case '\a':
    _Var1 = EverCrypt_AutoConfig2_has_vec256();
    if (_Var1) {
      Hacl_Hash_Blake2b_Simd256_hash_with_key
                (in_stack_000000e8,in_stack_000000e4,in_stack_000000d8,in_stack_000000d4,
                 in_stack_000000c8,in_stack_000000c4);
    }
    else {
      Hacl_Hash_Blake2b_hash_with_key(output,0x40,input,input_len,(uint8_t *)0x0,0);
    }
    break;
  case '\b':
    Hacl_Hash_SHA3_sha3_256(output,input,input_len);
    break;
  case '\t':
    Hacl_Hash_SHA3_sha3_224(output,input,input_len);
    break;
  case '\n':
    Hacl_Hash_SHA3_sha3_384(output,input,input_len);
    break;
  case '\v':
    Hacl_Hash_SHA3_sha3_512(output,input,input_len);
    break;
  default:
    fprintf(_stderr,"KaRaMeL incomplete match at %s:%d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/cryspen[P]hacl-packages/src/EverCrypt_Hash.c"
            ,0x95f);
    exit(0xfd);
  }
  return;
}

Assistant:

void
EverCrypt_Hash_Incremental_hash(
  Spec_Hash_Definitions_hash_alg a,
  uint8_t *output,
  uint8_t *input,
  uint32_t input_len
)
{
  switch (a)
  {
    case Spec_Hash_Definitions_MD5:
      {
        Hacl_Hash_MD5_hash_oneshot(output, input, input_len);
        break;
      }
    case Spec_Hash_Definitions_SHA1:
      {
        Hacl_Hash_SHA1_hash_oneshot(output, input, input_len);
        break;
      }
    case Spec_Hash_Definitions_SHA2_224:
      {
        hash_224(output, input, input_len);
        break;
      }
    case Spec_Hash_Definitions_SHA2_256:
      {
        EverCrypt_Hash_Incremental_hash_256(output, input, input_len);
        break;
      }
    case Spec_Hash_Definitions_SHA2_384:
      {
        Hacl_Hash_SHA2_hash_384(output, input, input_len);
        break;
      }
    case Spec_Hash_Definitions_SHA2_512:
      {
        Hacl_Hash_SHA2_hash_512(output, input, input_len);
        break;
      }
    case Spec_Hash_Definitions_SHA3_224:
      {
        Hacl_Hash_SHA3_sha3_224(output, input, input_len);
        break;
      }
    case Spec_Hash_Definitions_SHA3_256:
      {
        Hacl_Hash_SHA3_sha3_256(output, input, input_len);
        break;
      }
    case Spec_Hash_Definitions_SHA3_384:
      {
        Hacl_Hash_SHA3_sha3_384(output, input, input_len);
        break;
      }
    case Spec_Hash_Definitions_SHA3_512:
      {
        Hacl_Hash_SHA3_sha3_512(output, input, input_len);
        break;
      }
    case Spec_Hash_Definitions_Blake2S:
      {
        #if HACL_CAN_COMPILE_VEC128
        bool vec128 = EverCrypt_AutoConfig2_has_vec128();
        if (vec128)
        {
          Hacl_Hash_Blake2s_Simd128_hash_with_key(output, 32U, input, input_len, NULL, 0U);
          return;
        }
        Hacl_Hash_Blake2s_hash_with_key(output, 32U, input, input_len, NULL, 0U);
        #else
        Hacl_Hash_Blake2s_hash_with_key(output, 32U, input, input_len, NULL, 0U);
        #endif
        break;
      }
    case Spec_Hash_Definitions_Blake2B:
      {
        #if HACL_CAN_COMPILE_VEC256
        bool vec256 = EverCrypt_AutoConfig2_has_vec256();
        if (vec256)
        {
          Hacl_Hash_Blake2b_Simd256_hash_with_key(output, 64U, input, input_len, NULL, 0U);
          return;
        }
        Hacl_Hash_Blake2b_hash_with_key(output, 64U, input, input_len, NULL, 0U);
        #else
        Hacl_Hash_Blake2b_hash_with_key(output, 64U, input, input_len, NULL, 0U);
        #endif
        break;
      }
    default:
      {
        KRML_HOST_EPRINTF("KaRaMeL incomplete match at %s:%d\n", __FILE__, __LINE__);
        KRML_HOST_EXIT(253U);
      }
  }
}